

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

void __thiscall CJSONException::CJSONException(CJSONException *this,string *Msg,JSONErrorType Type)

{
  *(undefined ***)this = &PTR__CJSONException_00143d20;
  std::__cxx11::string::string((string *)&this->m_Msg,(string *)Msg);
  this->m_ErrType = Type;
  return;
}

Assistant:

CJSONException(const std::string &Msg, JSONErrorType Type) : m_Msg(Msg), m_ErrType(Type) {}